

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O3

void wipefile(char *aFilename)

{
  int iVar1;
  FILE *__stream;
  __off_t _Var2;
  stat st;
  stat local_a0;
  
  iVar1 = stat(aFilename,&local_a0);
  if (iVar1 != 0) {
    return;
  }
  __stream = fopen(aFilename,"w");
  if ((__stream != (FILE *)0x0) && (_Var2 = local_a0.st_size, 0 < local_a0.st_size)) {
    do {
      fputc(0x41,__stream);
      _Var2 = _Var2 + -1;
    } while (_Var2 != 0);
  }
  fclose(__stream);
  return;
}

Assistant:

static void wipefile(char const * const aFilename)
{
        int i;
        struct stat st;
        FILE * lIn;

        if (stat(aFilename, &st) == 0)
        {
                if ((lIn = fopen(aFilename, "w")))
                {
                        for (i = 0; i < st.st_size; i++)
                        {
                                fputc('A', lIn);
                        }
                }
                fclose(lIn);
        }
}